

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SW2048Game.cpp
# Opt level: O3

bool __thiscall SW2048Game::copyToLast(SW2048Game *this)

{
  int **ppiVar1;
  int **ppiVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  iVar6 = this->order;
  if (iVar6 < 1) {
    bVar5 = false;
  }
  else {
    ppiVar1 = this->last;
    ppiVar2 = this->board;
    lVar7 = 0;
    bVar5 = false;
    do {
      if (0 < iVar6) {
        piVar3 = ppiVar1[lVar7];
        piVar4 = ppiVar2[lVar7];
        lVar8 = 0;
        do {
          if (piVar3[lVar8] != piVar4[lVar8]) {
            piVar3[lVar8] = piVar4[lVar8];
            iVar6 = this->order;
            bVar5 = true;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar6);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar6);
  }
  return bVar5;
}

Assistant:

bool SW2048Game::copyToLast() {
	bool result = false;
	for(int y = 0; y<order; y++)
		for (int x = 0; x < order; x++) {
			if (last[y][x] != board[y][x]) {
				last[y][x] = board[y][x];
				result = true;
			}
		}
	return result;
}